

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

void vstprintf_s(tchar_t *Out,size_t OutLen,tchar_t *Mask,__va_list_tag *Arg)

{
  byte *pbVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  long *plVar7;
  double *pdVar8;
  fourcc_t *pfVar9;
  byte *pbVar10;
  undefined8 *puVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  size_t sVar15;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  int *piVar20;
  ulong *puVar21;
  ulong uVar22;
  byte bVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  
  while( true ) {
    uVar32 = 10;
    lVar24 = -1;
    uVar12 = 1;
    if (OutLen < 2) break;
    bVar23 = *Mask;
    if (bVar23 == 0x25) {
      bVar23 = ((byte *)Mask)[1];
      if (bVar23 == 0x25) {
        Mask = (tchar_t *)((byte *)Mask + 2);
        *Out = 0x25;
        goto LAB_00129f57;
      }
      pbVar6 = (byte *)Mask + 2;
      if (bVar23 != 0x2d) {
        pbVar6 = (byte *)Mask + 1;
      }
      uVar16 = (ulong)(((byte *)Mask)[2 - (ulong)(bVar23 != 0x2d)] == 0x30);
      bVar17 = pbVar6[uVar16];
      uVar18 = (uint)(char)bVar17;
      pbVar6 = pbVar6 + uVar16;
      if (0xfffffff5 < uVar18 - 0x3a) {
        lVar24 = 0;
        while (bVar17 = (byte)uVar18, 0xfffffff5 < (int)(char)bVar17 - 0x3aU) {
          lVar24 = lVar24 * 10 + (long)(char)bVar17 + -0x30;
          pbVar1 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
          uVar18 = (uint)*pbVar1;
        }
      }
      iVar5 = 0;
      if (bVar17 == 0x2e) {
        bVar17 = pbVar6[1];
        uVar18 = (uint)(char)bVar17;
        pbVar6 = pbVar6 + 1;
        iVar5 = 0;
        if (0xfffffff5 < uVar18 - 0x3a) {
          iVar5 = 0;
          while( true ) {
            bVar17 = (byte)uVar18;
            if (9 < (int)(char)bVar17 - 0x30U) break;
            iVar5 = ((int)(char)bVar17 - 0x30U) + iVar5 * 10;
            uVar18 = (uint)pbVar6[1];
            pbVar6 = pbVar6 + 1;
          }
        }
      }
      if (bVar17 == 0x2a) {
        uVar18 = Arg->gp_offset;
        if ((ulong)uVar18 < 0x29) {
          piVar20 = (int *)((ulong)uVar18 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar18 + 8;
        }
        else {
          piVar20 = (int *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = piVar20 + 2;
        }
        pbVar6 = pbVar6 + 1;
        lVar24 = (long)*piVar20;
      }
      uVar22 = 0;
      for (; bVar17 = *pbVar6, bVar17 == 0x6c; pbVar6 = pbVar6 + 1) {
        uVar22 = uVar12;
      }
      if ((bVar17 == 0x49) && (bVar17 = 0x49, pbVar6[1] == 0x36)) {
        if (pbVar6[2] == 0x34) {
          uVar22 = uVar12;
        }
        lVar25 = (ulong)(pbVar6[2] == 0x34) * 3;
        bVar17 = pbVar6[lVar25];
        pbVar6 = pbVar6 + lVar25;
      }
      bVar35 = bVar17 == 0x75;
      pbVar1 = pbVar6 + bVar35;
      bVar17 = pbVar6[bVar35];
      switch(bVar17) {
      case 99:
        lVar24 = lVar24 + -1;
        if (bVar23 != 0x2d) {
          for (; (0 < lVar24 && (1 < OutLen)); OutLen = OutLen - 1) {
            *Out = 0x20;
            Out = (tchar_t *)((byte *)Out + 1);
            lVar24 = lVar24 + -1;
          }
          lVar24 = lVar24 + -1;
        }
        uVar32 = Arg->gp_offset;
        if ((ulong)uVar32 < 0x29) {
          pbVar6 = (byte *)((ulong)uVar32 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar32 + 8;
        }
        else {
          pbVar6 = (byte *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = pbVar6 + 8;
        }
        *Out = *pbVar6;
        while( true ) {
          OutLen = OutLen - 1;
          Out = (tchar_t *)((byte *)Out + 1);
          if ((lVar24 < 1) || (OutLen < 2)) break;
          lVar24 = lVar24 + -1;
          *Out = 0x20;
        }
        break;
      case 100:
      case 0x69:
      case 0x78:
switchD_0012a08c_caseD_64:
        uVar18 = Arg->gp_offset;
        if (uVar22 == 0) {
          if (uVar18 < 0x29) {
            piVar20 = (int *)((ulong)uVar18 + (long)Arg->reg_save_area);
            Arg->gp_offset = uVar18 + 8;
          }
          else {
            piVar20 = (int *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = piVar20 + 2;
          }
          uVar12 = (ulong)*piVar20;
        }
        else {
          if (uVar18 < 0x29) {
            puVar21 = (ulong *)((long)Arg->reg_save_area + (ulong)uVar18);
            Arg->gp_offset = uVar18 + 8;
          }
          else {
            puVar21 = (ulong *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = puVar21 + 1;
          }
          uVar12 = *puVar21;
        }
        bVar36 = (*pbVar1 | 0x20) != 0x78;
        if (bVar36) {
          uVar22 = 100000000000;
        }
        else {
          uVar22 = 0x10000000;
          uVar32 = 0x10;
        }
        uVar31 = (ulong)((long)uVar12 < 0 && (bVar36 && !bVar35));
        uVar18 = 1;
        for (lVar24 = lVar24 - uVar31; 1 < lVar24; lVar24 = lVar24 + -1) {
          uVar18 = uVar18 * uVar32;
        }
        uVar26 = -uVar12;
        if (uVar31 == 0) {
          uVar26 = uVar12;
        }
        uVar12 = (ulong)uVar18;
        if ((long)(ulong)uVar18 < (long)uVar26) {
          uVar12 = uVar26;
        }
        for (; uVar12 < uVar22; uVar22 = uVar22 / uVar32) {
        }
        uVar12 = 1;
        for (; uVar22 != 0; uVar22 = uVar22 / uVar32) {
          uVar13 = (long)uVar26 / (long)uVar22;
          uVar18 = (uint)uVar13;
          if ((OutLen < 2) || (uVar31 == 0)) {
LAB_0012a58a:
            uVar34 = uVar12;
            if (1 < OutLen) goto LAB_0012a590;
          }
          else {
            if ((uVar22 == 1) || ((uVar16 != 0 || (uVar18 != 0)))) {
              *Out = 0x2d;
              Out = (tchar_t *)((byte *)Out + 1);
              OutLen = OutLen - 1;
              uVar31 = 0;
              goto LAB_0012a58a;
            }
LAB_0012a590:
            if (((uVar22 == 1) || (uVar18 != 0)) || (uVar16 != 0)) {
              bVar23 = (byte)uVar13;
              uVar16 = uVar12;
              if (uVar18 < 10) {
                bVar23 = bVar23 | 0x30;
              }
              else if (*pbVar1 == 0x58) {
                bVar23 = bVar23 + 0x37;
              }
              else {
                bVar23 = bVar23 + 0x57;
              }
            }
            else {
              bVar23 = 0x20;
              uVar16 = 0;
            }
            *Out = bVar23;
            Out = (tchar_t *)((byte *)Out + 1);
            uVar34 = OutLen - 1;
          }
          uVar26 = uVar26 - (uVar13 & 0xffffffff) * uVar22;
          OutLen = uVar34;
        }
        break;
      case 0x65:
switchD_0012a08c_caseD_65:
        uVar32 = Arg->fp_offset;
        if ((ulong)uVar32 < 0xa1) {
          pdVar8 = (double *)((ulong)uVar32 + (long)Arg->reg_save_area);
          Arg->fp_offset = uVar32 + 0x10;
        }
        else {
          pdVar8 = (double *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = pdVar8 + 1;
        }
        dVar37 = *pdVar8;
        if (dVar37 < 0.0) {
          *Out = 0x2d;
          Out = (tchar_t *)((byte *)Out + 1);
          OutLen = OutLen - 1;
          dVar37 = -dVar37;
        }
        if (1.0 <= dVar37) {
          iVar5 = -1;
          for (dVar38 = 1.0; 1.0 < dVar37 * dVar38; dVar38 = dVar38 * 10.0) {
            iVar5 = iVar5 + 1;
          }
          dVar37 = dVar37 * 10.0;
        }
        else {
          iVar5 = 0;
          for (dVar38 = 1.0; dVar37 * dVar38 < 1.0; dVar38 = dVar38 * 10.0) {
            iVar5 = iVar5 + -1;
          }
        }
        if (4 < OutLen) {
          dVar38 = dVar38 * dVar37;
          dVar39 = (dVar38 - (double)(int)dVar38) * 10.0;
          dVar37 = dVar39 + 1.0;
          if (dVar39 - (double)(int)dVar39 <= 0.5) {
            dVar37 = dVar39;
          }
          *Out = (char)(int)dVar38 + 0x30;
          ((byte *)Out)[1] = 0x2e;
          ((byte *)Out)[2] = (char)(int)dVar37 + 0x30;
          ((byte *)Out)[3] = *pbVar1;
          Out = (tchar_t *)((byte *)Out + 4);
          OutLen = OutLen - 4;
        }
        if (iVar5 < 0 && 1 < OutLen) {
          *Out = 0x2d;
          Out = (tchar_t *)((byte *)Out + 1);
          OutLen = OutLen - 1;
          iVar5 = -iVar5;
        }
        if (3 < OutLen) {
          cVar3 = (char)(iVar5 % 100);
          *Out = (char)(iVar5 / 100) + 0x30;
          ((byte *)Out)[1] = cVar3 / '\n' + 0x30;
          ((byte *)Out)[2] = cVar3 % '\n' + 0x30;
          Out = (tchar_t *)((byte *)Out + 3);
          OutLen = OutLen - 3;
        }
        break;
      case 0x66:
      case 0x67:
switchD_0012a08c_caseD_66:
        uVar32 = Arg->fp_offset;
        if ((ulong)uVar32 < 0xa1) {
          pdVar8 = (double *)((ulong)uVar32 + (long)Arg->reg_save_area);
          Arg->fp_offset = uVar32 + 0x10;
        }
        else {
          pdVar8 = (double *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = pdVar8 + 1;
        }
        dVar37 = *pdVar8;
        dVar38 = -dVar37;
        if (-dVar37 <= dVar37) {
          dVar38 = dVar37;
        }
        lVar25 = lVar24;
        pbVar6 = (byte *)Out;
        uVar16 = OutLen;
        if (-1 < lVar24) {
          lVar33 = -(ulong)(dVar37 < 0.0);
          iVar27 = ~(uint)(dVar37 < 0.0) + (int)lVar24;
          for (; ((long)uVar12 <= (long)dVar38 && (uVar12 < 0xccccccccccccccc));
              uVar12 = uVar12 * 10) {
            lVar33 = lVar33 + -1;
            iVar27 = iVar27 + -1;
          }
          iVar4 = get_decimals(iVar27,(long)dVar38);
          lVar25 = 1;
          lVar30 = (long)(int)dVar38;
          iVar19 = 0;
          iVar27 = 1;
          while (0 < iVar4) {
            iVar4 = iVar4 + -1;
            lVar25 = lVar25 * 10;
            uVar32 = (uint)((double)lVar25 * dVar38 - (double)(lVar30 * 10));
            lVar30 = lVar30 * 10 + (ulong)uVar32;
            if (uVar32 != 0) {
              iVar19 = iVar27;
            }
            iVar27 = iVar27 + 1;
          }
          iVar27 = iVar19;
          if (iVar19 < iVar5) {
            iVar27 = iVar5;
          }
          if (iVar5 < 1) {
            iVar27 = iVar19;
          }
          if (lVar24 < (long)((ulong)(iVar27 != 0) - lVar33)) {
            *Out = 0x65;
            Out = (tchar_t *)((byte *)Out + 1);
            OutLen = OutLen - 1;
            goto switchD_0012a08c_caseD_68;
          }
          pbVar10 = (byte *)Out;
          lVar30 = lVar24;
          for (uVar12 = OutLen;
              ((lVar25 = lVar24, pbVar6 = (byte *)Out, uVar16 = OutLen, bVar23 != 0x2d &&
               (lVar25 = lVar30, pbVar6 = pbVar10, uVar16 = uVar12,
               (int)((iVar27 + (uint)(iVar27 != 0)) - (int)lVar33) < lVar30)) && (1 < uVar12));
              uVar12 = uVar12 - 1) {
            *pbVar10 = 0x20;
            pbVar10 = pbVar10 + 1;
            lVar30 = lVar30 + -1;
          }
        }
        uVar32 = (uint)dVar38;
        Out = (tchar_t *)pbVar6;
        if ((dVar37 < 0.0) && (1 < uVar16)) {
          *pbVar6 = 0x2d;
          Out = (tchar_t *)(pbVar6 + 1);
          uVar16 = uVar16 - 1;
        }
        for (uVar12 = 1000000000; uVar32 + (uVar32 == 0) < (uint)uVar12; uVar12 = uVar12 / 10) {
        }
        uVar22 = (ulong)uVar32;
        OutLen = uVar16;
        for (; (int)uVar12 != 0; uVar12 = uVar12 / 10) {
          uVar16 = uVar22 / uVar12;
          uVar22 = uVar22 % uVar12;
          lVar24 = lVar25;
          uVar31 = 1;
          if (1 < OutLen) {
            if (-1 < lVar25) {
              lVar24 = -1;
              uVar31 = OutLen;
              if (lVar25 == 0) goto LAB_0012a883;
              lVar25 = lVar25 + -1;
            }
            *Out = (char)uVar16 + 0x30;
            Out = (tchar_t *)((byte *)Out + 1);
            lVar24 = lVar25;
            uVar31 = OutLen - 1;
          }
LAB_0012a883:
          lVar25 = lVar24;
          OutLen = uVar31;
        }
        if (iVar5 == 0) {
          iVar5 = 0x1e;
        }
        lVar24 = (long)(int)uVar32;
        iVar5 = get_decimals(iVar5,lVar24);
        lVar33 = 1;
        uVar18 = 0;
        uVar32 = 1;
        lVar30 = lVar33;
        lVar28 = lVar24;
        while (0 < iVar5) {
          iVar5 = iVar5 + -1;
          lVar30 = lVar30 * 10;
          uVar29 = (uint)((double)lVar30 * dVar38 - (double)(lVar28 * 10));
          lVar28 = lVar28 * 10 + (ulong)uVar29;
          if (uVar29 != 0) {
            uVar18 = uVar32;
          }
          uVar32 = uVar32 + 1;
        }
        uVar32 = 6;
        if (6 < uVar18) {
          uVar32 = uVar18;
        }
        if (uVar18 == 0) {
          uVar32 = uVar18;
        }
        if (*pbVar1 != 0x66) {
          uVar32 = uVar18;
        }
        if ((uVar32 != 0) && (1 < OutLen)) {
          *Out = 0x2e;
          lVar28 = 0;
          for (lVar30 = 0; (-uVar32 != (int)lVar30 && (1 < (OutLen - 1) + lVar30));
              lVar30 = lVar30 + -1) {
            lVar33 = lVar33 * 10;
            uVar18 = (uint)((double)lVar33 * dVar38 - (double)(lVar24 * 10));
            uVar12 = (ulong)uVar18;
            lVar24 = uVar12 + lVar24 * 10;
            if ((-uVar32 + 1 == (int)lVar30) && (5.0 <= (double)lVar33 * dVar38 - (double)lVar24)) {
              uVar12 = (ulong)(uVar18 + 1);
            }
            ((byte *)Out)[lVar28 + 1] = (char)uVar12 + 0x30;
            lVar28 = lVar28 + 1;
          }
          lVar25 = lVar25 + lVar30;
          OutLen = OutLen + lVar30;
          Out = (tchar_t *)((byte *)Out + -lVar30);
          while( true ) {
            OutLen = OutLen - 1;
            lVar25 = lVar25 + -1;
            Out = (tchar_t *)((byte *)Out + 1);
            if ((lVar25 < 1) || (OutLen < 2)) break;
            *Out = 0x20;
          }
        }
        break;
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x71:
      case 0x74:
      case 0x75:
      case 0x76:
      case 0x77:
switchD_0012a08c_caseD_68:
        break;
      case 0x70:
        for (; ((bVar23 != 0x2d && (8 < lVar24)) && (1 < OutLen)); OutLen = OutLen - 1) {
          lVar24 = lVar24 + -1;
          *Out = 0x20;
          Out = (tchar_t *)((byte *)Out + 1);
        }
        uVar32 = Arg->gp_offset;
        if ((ulong)uVar32 < 0x29) {
          plVar7 = (long *)((ulong)uVar32 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar32 + 8;
        }
        else {
          plVar7 = (long *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = plVar7 + 1;
        }
        lVar25 = *plVar7;
        for (iVar5 = 0x1c; (1 < OutLen && (-1 < iVar5)); iVar5 = iVar5 + -4) {
          uVar32 = (uint)(lVar25 >> ((byte)iVar5 & 0x3f)) & 0xf;
          cVar3 = (char)uVar32;
          bVar23 = cVar3 + 0x37;
          if (uVar32 < 10) {
            bVar23 = cVar3 + 0x30;
          }
          *Out = bVar23;
          Out = (tchar_t *)((byte *)Out + 1);
          OutLen = OutLen - 1;
        }
        for (; (8 < lVar24 && (1 < OutLen)); OutLen = OutLen - 1) {
          lVar24 = lVar24 + -1;
          *Out = 0x20;
          Out = (tchar_t *)((byte *)Out + 1);
        }
        break;
      case 0x72:
        uVar32 = Arg->gp_offset;
        if ((ulong)uVar32 < 0x29) {
          pfVar9 = (fourcc_t *)((ulong)uVar32 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar32 + 8;
        }
        else {
          pfVar9 = (fourcc_t *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = pfVar9 + 2;
        }
        if (4 < OutLen) {
          sVar14 = FourCCToString(Out,OutLen,*pfVar9);
          Out = (tchar_t *)((byte *)Out + sVar14);
          OutLen = OutLen + sVar14;
        }
        break;
      case 0x73:
        uVar32 = Arg->gp_offset;
        if ((ulong)uVar32 < 0x29) {
          puVar11 = (undefined8 *)((ulong)uVar32 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar32 + 8;
        }
        else {
          puVar11 = (undefined8 *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = puVar11 + 1;
        }
        pcVar2 = (char *)*puVar11;
        if (pcVar2 == (char *)0x0) goto switchD_0012a08c_caseD_68;
        sVar15 = strlen(pcVar2);
        uVar12 = OutLen - 1;
        if (sVar15 < OutLen - 1) {
          uVar12 = sVar15;
        }
        lVar24 = lVar24 - uVar12;
        if (bVar23 != 0x2d) {
          for (; (0 < lVar24 && (1 < OutLen)); OutLen = OutLen - 1) {
            *Out = 0x20;
            Out = (tchar_t *)((byte *)Out + 1);
            lVar24 = lVar24 + -1;
          }
          lVar24 = lVar24 + -1;
        }
        memcpy(Out,pcVar2,uVar12);
        Out = (tchar_t *)((byte *)Out + uVar12);
        for (OutLen = OutLen - uVar12; (0 < lVar24 && (1 < OutLen)); OutLen = OutLen - 1) {
          lVar24 = lVar24 + -1;
          *Out = 0x20;
          Out = (tchar_t *)((byte *)Out + 1);
        }
        break;
      default:
        if (bVar17 == 0x45) goto switchD_0012a08c_caseD_65;
        if (bVar17 == 0x47) goto switchD_0012a08c_caseD_66;
        if (bVar17 != 0x53) {
          if (bVar17 != 0x58) goto switchD_0012a08c_caseD_68;
          goto switchD_0012a08c_caseD_64;
        }
        uVar32 = Arg->gp_offset;
        if ((ulong)uVar32 < 0x29) {
          puVar11 = (undefined8 *)((ulong)uVar32 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar32 + 8;
        }
        else {
          puVar11 = (undefined8 *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = puVar11 + 1;
        }
        pcVar2 = (char *)*puVar11;
        sVar15 = strlen(pcVar2);
        uVar12 = OutLen - 1;
        if (sVar15 < OutLen - 1) {
          uVar12 = sVar15;
        }
        lVar24 = lVar24 - uVar12;
        if (bVar23 != 0x2d) {
          for (; (0 < lVar24 && (1 < OutLen)); OutLen = OutLen - 1) {
            *Out = 0x20;
            Out = (tchar_t *)((byte *)Out + 1);
            lVar24 = lVar24 + -1;
          }
          lVar24 = lVar24 + -1;
        }
        for (uVar16 = 0;
            ((uVar12 != uVar16 && (1 < OutLen)) && (bVar23 = pcVar2[uVar16], bVar23 != 0));
            uVar16 = uVar16 + 1) {
          ((byte *)Out)[uVar16] = bVar23;
          OutLen = OutLen - 1;
        }
        Out = (tchar_t *)((byte *)Out + uVar16);
        for (; (0 < lVar24 && (1 < OutLen)); OutLen = OutLen - 1) {
          lVar24 = lVar24 + -1;
          *Out = 0x20;
          Out = (tchar_t *)((byte *)Out + 1);
        }
      }
      Mask = (tchar_t *)(pbVar1 + 1);
    }
    else {
      if (bVar23 == 0) goto LAB_0012aa6b;
      Mask = (tchar_t *)((byte *)Mask + 1);
      *Out = bVar23;
LAB_00129f57:
      Out = (tchar_t *)((byte *)Out + 1);
      OutLen = OutLen - 1;
    }
  }
  if (OutLen == 0) {
    __assert_fail("OutLen>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                  ,0x285,
                  "void vstprintf_s(tchar_t *, size_t, const tchar_t *, struct __va_list_tag *)");
  }
LAB_0012aa6b:
  *Out = 0;
  return;
}

Assistant:

void vstprintf_s(tchar_t* Out,size_t OutLen,const tchar_t* Mask,va_list Arg)
{
    int64_t vl;
	int vs;
    double dvs, _dvs;
	intptr_t Width,ptr;
	unsigned int v,w,q,w0;
	bool_t ZeroFill;
	bool_t Unsigned;
	bool_t Sign;
	bool_t AlignLeft;
    bool_t Long;
    int Decimals;
	const tchar_t *In;
	const char *InA;
	size_t n;
    int64_t lvs,_lvs,ww;

	while (OutLen>1 && *Mask)
	{
		switch (*Mask)
		{
		case '%':
			++Mask;

			if (*Mask == '%')
			{
				*(Out++) = *(Mask++);
				--OutLen;
				break;
			}

			AlignLeft = *Mask=='-';
			if (AlignLeft)
				++Mask;

			ZeroFill = *Mask=='0';
			if (ZeroFill)
				++Mask;

			Width = -1;
			if (IsDigit(*Mask))
			{
				Width = 0;
				for (;IsDigit(*Mask);++Mask)
					Width = Width*10 + (*Mask-'0');
			}

            Decimals = *Mask=='.';
			if (Decimals)
            {
				++Mask;
                Decimals = 0;
			    if (IsDigit(*Mask))
			    {
				    for (;IsDigit(*Mask);++Mask)
					    Decimals = Decimals*10 + (*Mask-'0');
			    }
            }

            Long = 0;
            if (*Mask == '*')
			{
				++Mask;
				Width = va_arg(Arg,int);
			}

            while (*Mask == 'l')
            {
                Long=1;
				++Mask; // long
            }

            if (*Mask=='I' && *(Mask+1)=='6' && *(Mask+2)=='4')
            {
                Long=1;
				Mask += 3;
            }

			Unsigned = *Mask=='u';
			if (Unsigned)
				++Mask;

			switch (*Mask)
			{
			case 'd':
			case 'i':
			case 'X':
			case 'x':
                if (Long)
				    vl = va_arg(Arg,int64_t);
                else
				    vl = va_arg(Arg,int);

				if (*Mask=='x' || *Mask=='X')
				{
					Unsigned = 1;
					q = 16;
					ww = 0x10000000;
				}
				else
				{
					q = 10;
					ww = 100000000000;
				}

				Sign = vl<0 && !Unsigned;
				if (Sign)
				{
					vl=-vl;
					--Width;
				}

				w0 = 1;
				for (;Width>1;--Width)
					w0 *= q;

				v = vl;
				while (vl<ww && ww>w0)
					ww/=q;

				while (ww>0)
				{
					unsigned int i = (unsigned int)(vl/ww); // between 0 and q-1
					vl-=i*ww;
					if (OutLen>1 && Sign && (ww==1 || ZeroFill || i>0))
					{
						*(Out++) = '-';
						--OutLen;
						Sign = 0;
					}
					if (OutLen>1)
					{
						if (i==0 && !ZeroFill && ww!=1)
							i = ' ';
						else
						{
							ZeroFill = 1;
							if (i>=10)
							{
								if (*Mask == 'X')
									i += 'A'-10;
								else
									i += 'a'-10;
							}
							else
								i+='0';
						}
						*(Out++) = (tchar_t)i;
						--OutLen;
					}
					ww/=q;
				}

				break;

			case 'c':
				Width -= 1;
				if (!AlignLeft)
					while (--Width>=0 && OutLen>1)
					{
						*Out++ = ' ';
						--OutLen;
					}
				*(Out++) = (tchar_t)va_arg(Arg,int);
				--OutLen;
				while (--Width>=0 && OutLen>1)
				{
					*Out++ = ' ';
					--OutLen;
				}
				break;

			case 's':
				In = va_arg(Arg,const tchar_t*);
                if (In)
                {
				    n = MIN(tcslen(In),OutLen-1);
				    Width -= n;
				    if (!AlignLeft)
					    while (--Width>=0 && OutLen>1)
					    {
						    *Out++ = ' ';
						    --OutLen;
					    }
				    memcpy(Out,In,n*sizeof(tchar_t));
				    Out += n;
				    OutLen -= n;
				    while (--Width>=0 && OutLen>1)
				    {
					    *Out++ = ' ';
					    --OutLen;
				    }
                }
				break;
			case 'S':
				InA = va_arg(Arg,const char*);
				n = MIN(strlen(InA),OutLen-1);
				Width -= n;
				if (!AlignLeft)
					while (--Width>=0 && OutLen>1)
					{
						*Out++ = ' ';
						--OutLen;
					}
                for (;n>0 && OutLen>1 && *InA;++InA,++Out,--OutLen,--n)
                    *Out = *InA;
    			while (--Width>=0 && OutLen>1)
				{
					*Out++ = ' ';
					--OutLen;
				}
				break;
            case 'g':
            case 'G':
            case 'f':
                dvs = va_arg(Arg,double);
                if (OutLen)
                {
			        Sign = dvs<0;
                    if (Sign && OutLen>1)
                        dvs = -dvs;

                    if (Width >= 0)
                    {
                        // count integer digits and decimal digits to adjust the alignment
                        int max_integer_digits = get_integers((int64_t)dvs);
                        int max_decimal_digits = get_decimals(Width - max_integer_digits - 1 - (Sign?1:0),(int64_t)dvs);
                        int max_total_chars;

                        vs = (int)dvs;
                        lvs = 1;
                        _lvs = vs;
                        w = w0 = 0; // decimals in use
                        while (max_decimal_digits-->0)
                        {
                            lvs *= 10;
                            _lvs *= 10;
                            q = (int)(dvs * lvs - (double)_lvs);
                            _lvs += q;
                            w0++;
                            if (q)
                                w = w0;
                        }

                        if (Decimals>0)
                            max_decimal_digits = MAX(Decimals,(int)w);
                        else
                            max_decimal_digits = w;

                        max_total_chars = max_integer_digits + max_decimal_digits + (Sign?1:0) + (max_decimal_digits?1:0);

                        if (max_integer_digits + (Sign?1:0) + (max_decimal_digits?1:0) > Width)
                            goto do_exponent;

                        while (!AlignLeft && Width > max_total_chars && OutLen > 1)
                        {
                            *Out++ = ' ';
                            --Width;
                            --OutLen;
                        }
                    }

                    // integer part
                    vs = (int)dvs;
			        v = vs;

                    if (Sign && dvs!=0.0 && OutLen > 1)
                    {
                        *Out++ = '-';
                        --OutLen;
                    }

				    w = 1000000000;
			        while (w>v && w>1)
				        w/=10;

                    // integer filling
                    while (w>0)
			        {
				        unsigned int i = v/w;
				        v-=i*w;
				        if (OutLen>1 && (Width<0 || Width-->0))
				        {
					        i+='0';
					        *(Out++) = (tchar_t)i;
					        --OutLen;
                        }
				        w/=10;
                    }

                    // decimal part
                    // dry run to count the number of necessary decimals
                    v = Decimals;
                    if (!Decimals)
                        Decimals=30;
                    Decimals = get_decimals(Decimals,vs);
                    lvs = 1;
                    _lvs = vs;
                    w = w0 = 0; // decimals in use
                    while (Decimals-->0)
                    {
                        lvs *= 10;
                        _lvs *= 10;
                        q = (int)(dvs * lvs - (double)_lvs);
                        _lvs += q;
                        w0++;
                        if (q)
                            w = w0;
                    }

                    if (*Mask==T('f') && w)
                        w = MAX(w,6);
                    if (w && OutLen>1)
                    {
                        *Out++ = T('.');
                        --OutLen;
                        --Width;

                        v -= w;

                        lvs = 1;
                        _lvs = vs;
                        while (w-->0 && OutLen>1)
                        {
                            lvs *= 10;
                            _lvs *= 10;
                            q = (int)(dvs * lvs - (double)_lvs);
                            _lvs += q;
                            if (w==0) // last one, do some rounding
                            {
                                if ((dvs * lvs - (double)_lvs) >= 5)
                                    q++;
                            }
                            *Out++ = (tchar_t)(q + '0');
                            --OutLen;
                            --Width;
                        }
                        while (Width-- > 0 && OutLen > 1)
                        {
                            *Out++ = ' ';
                            --OutLen;
                        }
                    }
                    break;
do_exponent:
                    // TODO
                    *Out++ = T('e');
                    OutLen--;
                }
                break;
            case 'e':
            case 'E':
                dvs = va_arg(Arg,double);
				Sign = dvs<0;
                if (Sign && OutLen>1)
                {
                    *Out++ = '-';
                    OutLen--;
                    dvs = -dvs;
                }
                vs = 0; // exponent
                _dvs = 1.0; // factor
                if (dvs >= 1.0)
                {
                    while (dvs*_dvs > 1.0)
                    {
                        _dvs *= 10.0;
                        vs++;
                    }
                    dvs *= 10.0;
                    vs--;
                }
                else
                {
                    while (dvs*_dvs < 1.0)
                    {
                        _dvs *= 10.0;
                        vs--;
                    }
                }

                dvs *= _dvs;
                if (OutLen > 4)
                {
                    *Out++ = (tchar_t)((int)dvs + T('0'));
                    *Out++ = T('.');
                    dvs -= (int)dvs;
                    dvs *= 10.0;
                    if (dvs - (int)dvs > 0.5)
                        *Out++ = (tchar_t)((int)(dvs+1) + T('0'));
                    else
                        *Out++ = (tchar_t)((int)(dvs) + T('0'));
                    *Out++ = *Mask;
                    OutLen -= 4;
                }
                if (OutLen > 1 && vs < 0)
                {
                    *Out++ = T('-');
                    OutLen--;
                    vs = -vs;
                }
                if (OutLen > 3)
                {
                    *Out++ = (tchar_t)((vs / 100) + T('0'));
                    vs %= 100;
                    *Out++ = (tchar_t)((vs / 10) + T('0'));
                    vs %= 10;
                    *Out++ = (tchar_t)(vs + T('0'));
                    OutLen -= 3;
                }
                break;
            case 'p':
                while (Width > 8 && !AlignLeft && OutLen > 1)
                {
                    Width--;
                    *Out++ = ' ';
                    OutLen--;
                }
                ptr = va_arg(Arg,intptr_t);
                for (vs=28;OutLen>1 && vs>=0;vs-=4)
                {
                    q = (ptr>>vs) & 0x0F;
                    if (q<10)
                        *Out++ = (tchar_t)(q+T('0'));
                    else
                        *Out++ = (tchar_t)(q+T('A')-10);
                    OutLen--;
                }
                while (Width > 8 && OutLen > 1)
                {
                    Width--;
                    *Out++ = ' ';
                    OutLen--;
                }
                break;
            case 'r':
                {
                    fourcc_t FourCC = va_arg(Arg,fourcc_t);
                    if (OutLen > 4)
                    {
                        size_t Written = FourCCToString(Out,OutLen,FourCC);
                        Out+=Written;
                        OutLen+=Written;
                    }
                }
                break;
			}

			++Mask;
			break;

		default:
			*(Out++) = *(Mask++);
			--OutLen;
			break;
		}
	}

	assert(OutLen>0);
    if (OutLen>0)
        *Out=0;
}